

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,qulonglong number,int fieldWidth,
                 char32_t fillChar)

{
  uint uVar1;
  uint flags;
  qsizetype qVar2;
  QLocaleData *localeData;
  uint width;
  long padding;
  long in_FS_OFFSET;
  QStringView text;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = -fieldWidth;
  if (0 < fieldWidth) {
    uVar1 = fieldWidth;
  }
  width = 0xffffffff;
  if (fillChar == L'0') {
    width = uVar1;
  }
  flags = calculateFlags(fieldWidth,fillChar,this);
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  localeData = (QLocaleData *)0xa;
  QLocaleData::unsLongLongToString
            (__return_storage_ptr__,((this->d).d.ptr)->m_data,number,-1,10,width,flags);
  text.m_data = (__return_storage_ptr__->d).ptr;
  text.m_size = (__return_storage_ptr__->d).size;
  qVar2 = stringWidth(text);
  padding = (ulong)uVar1 - qVar2;
  if (padding != 0 && qVar2 <= (long)(ulong)uVar1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    calculateFiller((QString *)&local_58,padding,fillChar,(qsizetype)((this->d).d.ptr)->m_data,
                    localeData);
    if (fieldWidth < 0) {
      QString::append(__return_storage_ptr__,(QString *)&local_58);
    }
    else {
      QString::prepend(__return_storage_ptr__,(QString *)&local_58);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(qulonglong number, int fieldWidth, char32_t fillChar) const
{
    int absFieldWidth = qAbs(fieldWidth);
    int width = (fillChar == U'0') ? absFieldWidth : -1;
    unsigned flags = calculateFlags(fieldWidth, fillChar, *this);

    QString result = d->m_data->unsLongLongToString(number, -1, 10, width, flags);
    qsizetype padding = absFieldWidth - stringWidth(result);

    if (padding > 0) {
        QString filler = calculateFiller(padding, fillChar, fieldWidth, d->m_data);
        if (fieldWidth < 0)
            result.append(filler);
        else
            result.prepend(filler);
    }
    return result;
}